

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewOps.cpp
# Opt level: O3

string_view gmlc::utilities::string_viewOps::getTailString(string_view input,string_view sep)

{
  size_type sVar1;
  long lVar2;
  string_view sVar3;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20._M_str = input._M_str;
  local_20._M_len = input._M_len;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                    (&local_20,sep._M_str,0xffffffffffffffff,sep._M_len);
  lVar2 = 0;
  if (sVar1 != 0xffffffffffffffff) {
    lVar2 = sep._M_len + sVar1;
  }
  sVar3._M_len = local_20._M_len - lVar2;
  sVar3._M_str = local_20._M_str + lVar2;
  return sVar3;
}

Assistant:

std::string_view
    getTailString(std::string_view input, std::string_view sep) noexcept
{
    auto sepLoc = input.rfind(sep);
    if (sepLoc != std::string_view::npos) {
        input.remove_prefix(sepLoc + sep.size());
    }
    return input;
}